

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

void __thiscall gl4cts::GLSL420Pack::InitializerListTest::logTestCaseName(InitializerListTest *this)

{
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar1;
  TestError *this_02;
  undefined1 local_198 [8];
  MessageBuilder message;
  testCase *test_case;
  InitializerListTest *this_local;
  
  message.m_str._368_8_ =
       std::
       vector<gl4cts::GLSL420Pack::InitializerListTest::testCase,_std::allocator<gl4cts::GLSL420Pack::InitializerListTest::testCase>_>
       ::operator[](&this->m_test_cases,(long)this->m_current_test_case_index);
  this_00 = deqp::Context::getTestContext
                      ((this->super_GLSLTestBase).super_TestBase.super_TestCase.m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_198,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  switch(*(undefined4 *)message.m_str._368_8_) {
  case 0:
    pMVar1 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_198,(char (*) [17])"List. Single vec");
    tcu::MessageBuilder::operator<<(pMVar1,(uint *)(message.m_str._368_8_ + 8));
    break;
  case 1:
    pMVar1 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_198,(char (*) [17])"List. Single mat");
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(uint *)(message.m_str._368_8_ + 4));
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2a8224a);
    tcu::MessageBuilder::operator<<(pMVar1,(uint *)(message.m_str._368_8_ + 8));
    break;
  case 2:
    pMVar1 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_198,(char (*) [16])"Ctr. Single mat");
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(uint *)(message.m_str._368_8_ + 4));
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2a8224a);
    tcu::MessageBuilder::operator<<(pMVar1,(uint *)(message.m_str._368_8_ + 8));
    break;
  case 3:
    tcu::MessageBuilder::operator<<((MessageBuilder *)local_198,(char (*) [16])"List. Structure");
    break;
  case 4:
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(char (*) [23])"List. Array of scalars");
    break;
  case 5:
    pMVar1 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_198,(char (*) [18])"Ctr. Array of vec");
    tcu::MessageBuilder::operator<<(pMVar1,(uint *)(message.m_str._368_8_ + 8));
    break;
  case 6:
    pMVar1 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_198,(char (*) [19])"List. Array of vec");
    tcu::MessageBuilder::operator<<(pMVar1,(uint *)(message.m_str._368_8_ + 8));
    break;
  case 7:
    pMVar1 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_198,(char (*) [18])"Ctr. Array of mat");
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(uint *)(message.m_str._368_8_ + 4));
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2a8224a);
    tcu::MessageBuilder::operator<<(pMVar1,(uint *)(message.m_str._368_8_ + 8));
    break;
  case 8:
    pMVar1 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_198,(char (*) [19])"List. Array of mat");
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(uint *)(message.m_str._368_8_ + 4));
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2a8224a);
    tcu::MessageBuilder::operator<<(pMVar1,(uint *)(message.m_str._368_8_ + 8));
    break;
  case 9:
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(char (*) [26])"List. Array of structures");
    break;
  case 10:
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(char (*) [22])"Ctr. Nested structure");
    break;
  case 0xb:
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(char (*) [23])"List. Nested structure");
    break;
  case 0xc:
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(char (*) [37])"List. Structure with structure array");
    break;
  case 0xd:
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(char (*) [36])"Mix. Structure with structure array");
    break;
  case 0xe:
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,
               (char (*) [42])"List. Array of structures with structures");
    break;
  case 0xf:
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(char (*) [41])"Mix. Array of structures with structures"
              );
    break;
  case 0x10:
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,
               (char (*) [42])"List. Structure with structure with array");
    break;
  case 0x11:
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(char (*) [41])"Mix. Structure with structure with array"
              );
    break;
  case 0x12:
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(char (*) [31])"List. Unsized array of scalars");
    break;
  case 0x13:
    pMVar1 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_198,(char (*) [27])"List. Unsized array of vec");
    tcu::MessageBuilder::operator<<(pMVar1,(uint *)(message.m_str._368_8_ + 8));
    break;
  case 0x14:
    pMVar1 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_198,(char (*) [27])"List. Unsized array of mat");
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(uint *)(message.m_str._368_8_ + 4));
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2a8224a);
    tcu::MessageBuilder::operator<<(pMVar1,(uint *)(message.m_str._368_8_ + 8));
    break;
  case 0x15:
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(char (*) [34])"List. Unsized array of structures");
    break;
  default:
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_02,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x3776);
    __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_198);
  return;
}

Assistant:

void InitializerListTest::logTestCaseName()
{
	const testCase& test_case = m_test_cases[m_current_test_case_index];

	tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

	switch (test_case.m_initializer)
	{
	case VECTOR:
		message << "List. Single vec" << test_case.m_n_rows;
		break;
	case MATRIX:
		message << "List. Single mat" << test_case.m_n_cols << "x" << test_case.m_n_rows;
		break;
	case MATRIX_ROWS:
		message << "Ctr. Single mat" << test_case.m_n_cols << "x" << test_case.m_n_rows;
		break;
	case STRUCT:
		message << "List. Structure";
		break;
	case NESTED_STRUCT_CTR:
		message << "Ctr. Nested structure";
		break;
	case NESTED_STRUCT_LIST:
		message << "List. Nested structure";
		break;
	case NESTED_STURCT_ARRAYS_STRUCT_LIST:
		message << "List. Structure with structure array";
		break;
	case NESTED_STURCT_ARRAYS_STRUCT_MIX:
		message << "Mix. Structure with structure array";
		break;
	case NESTED_STRUCT_STRUCT_ARRAY_LIST:
		message << "List. Structure with structure with array";
		break;
	case NESTED_STRUCT_STRUCT_ARRAY_MIX:
		message << "Mix. Structure with structure with array";
		break;
	case ARRAY_SCALAR:
		message << "List. Array of scalars";
		break;
	case ARRAY_VECTOR_CTR:
		message << "Ctr. Array of vec" << test_case.m_n_rows;
		break;
	case ARRAY_VECTOR_LIST:
		message << "List. Array of vec" << test_case.m_n_rows;
		break;
	case ARRAY_MATRIX_CTR:
		message << "Ctr. Array of mat" << test_case.m_n_cols << "x" << test_case.m_n_rows;
		break;
	case ARRAY_MATRIX_LIST:
		message << "List. Array of mat" << test_case.m_n_cols << "x" << test_case.m_n_rows;
		break;
	case ARRAY_STRUCT:
		message << "List. Array of structures";
		break;
	case NESTED_ARRAY_STRUCT_STRUCT_LIST:
		message << "List. Array of structures with structures";
		break;
	case NESTED_ARRAY_STRUCT_STRUCT_MIX:
		message << "Mix. Array of structures with structures";
		break;
	case UNSIZED_ARRAY_SCALAR:
		message << "List. Unsized array of scalars";
		break;
	case UNSIZED_ARRAY_VECTOR:
		message << "List. Unsized array of vec" << test_case.m_n_rows;
		break;
	case UNSIZED_ARRAY_MATRIX:
		message << "List. Unsized array of mat" << test_case.m_n_cols << "x" << test_case.m_n_rows;
		break;
	case UNSIZED_ARRAY_STRUCT:
		message << "List. Unsized array of structures";
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	message << tcu::TestLog::EndMessage;
}